

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_validateTest_Test::TestBody(OpenDDLParserTest_validateTest_Test *this)

{
  bool bVar1;
  FILE *__stream;
  size_type __new_size;
  size_t len;
  char *in_R9;
  AssertHelper AStack_118;
  AssertionResult gtest_ar__2;
  AssertHelper local_100;
  vector<char,_std::allocator<char>_> buffer;
  AssertionResult gtest_ar_;
  char token [62];
  OpenDDLParser parser;
  
  OpenDDLParser::OpenDDLParser(&parser);
  __stream = fopen("/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/TestData/clusterfuzz-testcase-minimized-assimp_fuzzer-5699047558742016"
                   ,"rb");
  fseek(__stream,0,2);
  __new_size = ftell(__stream);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::resize(&buffer,__new_size);
  fread(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start,__new_size,1,__stream);
  fclose(__stream);
  OpenDDLParser::setBuffer(&parser,&buffer);
  bVar1 = OpenDDLParser::validate(&parser);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)token,(internal *)&gtest_ar_,(AssertionResult *)"result","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x33f,(char *)token._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&AStack_118);
    std::__cxx11::string::~string((string *)token);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  }
  OpenDDLParser::clear(&parser);
  OpenDDLParser::setBuffer(&parser,&buffer);
  gtest_ar_.success_ = OpenDDLParser::validate(&parser);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)token,(internal *)&gtest_ar_,(AssertionResult *)"result","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x345,(char *)token._0_8_);
    testing::internal::AssertHelper::operator=(&AStack_118,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&AStack_118);
    std::__cxx11::string::~string((string *)token);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  OpenDDLParser::clear(&parser);
  builtin_strncpy(token + 0x30,"test\"\n    }\n}",0xe);
  builtin_strncpy(token + 0x20,"\n    {\n        \"",0x10);
  builtin_strncpy(token + 0x10,"de1\n{\n    string",0x10);
  builtin_strncpy(token,"GeometryNode $no",0x10);
  len = strlen(token);
  OpenDDLParser::setBuffer(&parser,token,len);
  gtest_ar__2.success_ = OpenDDLParser::validate(&parser);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!gtest_ar__2.success_) {
    testing::Message::Message((Message *)&AStack_118);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)"result","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x353,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&AStack_118);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&AStack_118);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  OpenDDLParser::~OpenDDLParser(&parser);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, validateTest) {
    OpenDDLParser parser;

    FILE *fileStream = ::fopen(OPENDDL_TEST_DATA "/clusterfuzz-testcase-minimized-assimp_fuzzer-5699047558742016", "rb");
    fseek(fileStream, 0, SEEK_END);
    const size_t size = ::ftell(fileStream);
    std::vector<char> buffer;
    buffer.resize(size);
    ::fread(&buffer[0], size, sizeof(char), fileStream);
    ::fclose(fileStream);

    parser.setBuffer(buffer);
    bool result = parser.validate();
    EXPECT_FALSE(result);

    buffer.clear();
    parser.clear();
    parser.setBuffer(buffer);
    result = parser.validate();
    EXPECT_TRUE(result);

    parser.clear();
    char token[] =
            "GeometryNode $node1\n"
            "{\n"
            "    string\n"
            "    {\n"
            "        \"test\"\n"
            "    }\n"
            "}";

    parser.setBuffer(token, strlen(token));
    result = parser.validate();
    EXPECT_TRUE(result);
}